

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::sectionEndedEarly(RunContext *this,SectionEndInfo *endInfo)

{
  bool bVar1;
  reference ppIVar2;
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  *in_RSI;
  value_type *in_RDI;
  vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *unaff_retaddr;
  
  bVar1 = std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::empty
                    (unaff_retaddr);
  if (bVar1) {
    ppIVar2 = std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back(in_RSI);
    (*((*ppIVar2)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[0xb])();
  }
  else {
    ppIVar2 = std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back(in_RSI);
    (*((*ppIVar2)->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
      _vptr_NonCopyable[10])();
  }
  std::
  vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
  ::pop_back((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              *)0x18e23d);
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::push_back
            (unaff_retaddr,in_RDI);
  return;
}

Assistant:

virtual void sectionEndedEarly( SectionEndInfo const& endInfo ) {
            if( m_unfinishedSections.empty() )
                m_activeSections.back()->fail();
            else
                m_activeSections.back()->close();
            m_activeSections.pop_back();

            m_unfinishedSections.push_back( endInfo );
        }